

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O3

void usrc_writeArrayOfMostlyInvChars(FILE *f,char *prefix,char *p,int32_t length,char *postfix)

{
  byte bVar1;
  ulong uVar2;
  char *__format;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  if (prefix != (char *)0x0) {
    fprintf((FILE *)f,prefix,(long)length);
  }
  if (0 < length) {
    uVar2 = 0;
    iVar5 = 0;
    uVar4 = 0xffffffff;
    uVar3 = 0xffffffff;
    do {
      bVar1 = p[uVar2];
      if (uVar2 != 0) {
        if (((iVar5 < 0x20) && (((int)uVar4 < 0x20 || iVar5 < 0x18) || uVar3 != 0)) &&
           ((iVar5 < 0x10 || (0x1e < (byte)(bVar1 - 1) || (int)uVar3 < 0x20 && uVar3 != 0)))) {
          fputc(0x2c,(FILE *)f);
        }
        else {
          fputs(",\n",(FILE *)f);
          iVar5 = 0;
        }
      }
      __format = "\'%c\'";
      if (bVar1 < 0x20) {
        __format = "%u";
      }
      fprintf((FILE *)f,__format,(ulong)(uint)bVar1);
      uVar2 = uVar2 + 1;
      iVar5 = iVar5 + 1;
      uVar4 = uVar3;
      uVar3 = (uint)bVar1;
    } while ((uint)length != uVar2);
  }
  if (postfix == (char *)0x0) {
    return;
  }
  fputs(postfix,(FILE *)f);
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeArrayOfMostlyInvChars(FILE *f,
                                const char *prefix,
                                const char *p, int32_t length,
                                const char *postfix) {
    int32_t i, col;
    int prev2, prev, c;

    if(prefix!=NULL) {
        fprintf(f, prefix, (long)length);
    }
    prev2=prev=-1;
    for(i=col=0; i<length; ++i, ++col) {
        c=(uint8_t)p[i];
        if(i>0) {
            /* Break long lines. Try to break at interesting places, to minimize revision diffs. */
            if( 
                /* Very long line. */
                col>=32 ||
                /* Long line, break after terminating NUL. */
                (col>=24 && prev2>=0x20 && prev==0) ||
                /* Medium-long line, break before non-NUL, non-character byte. */
                (col>=16 && (prev==0 || prev>=0x20) && 0<c && c<0x20)
            ) {
                fputs(",\n", f);
                col=0;
            } else {
                fputc(',', f);
            }
        }
        fprintf(f, c<0x20 ? "%u" : "'%c'", c);
        prev2=prev;
        prev=c;
    }
    if(postfix!=NULL) {
        fputs(postfix, f);
    }
}